

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::read_real_array(Simulator *this,PCode *code)

{
  vector<double,_std::allocator<double>_> *__x;
  double dVar1;
  int iVar2;
  Symbol *pSVar3;
  vector<double,_std::allocator<double>_> array;
  double input;
  vector<double,_std::allocator<double>_> local_48;
  double local_30;
  
  local_30 = 0.0;
  pSVar3 = ScopeTree::resolve(&this->tree_,&code->first_);
  std::istream::_M_extract<double>((double *)&std::cin);
  __x = &(pSVar3->value_).real_array;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__x);
  dVar1 = local_30;
  iVar2 = get_second_parameter(this,&code->second_);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = dVar1;
  std::vector<double,_std::allocator<double>_>::operator=(__x,&local_48);
  pSVar3->is_assigned_ = true;
  this->eip_ = this->eip_ + 1;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::read_real_array(const PCode &code) {
    double input = 0;
    Symbol &symbol = tree_.resolve(code.first());

    std::cin >> input;
    std::vector<double> array = symbol.real_array();
    array[get_second_parameter(code.second())] = input;
    symbol.set_value(array);
    symbol.set_assigned();

    inc_eip();
}